

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverPMINRES.cpp
# Opt level: O2

double __thiscall
chrono::ChSolverPMINRES::Solve_SupportingStiffness(ChSolverPMINRES *this,ChSystemDescriptor *sysd)

{
  int *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  ChLog *pCVar12;
  ChStreamOutAscii *pCVar13;
  Scalar *pSVar14;
  int iter;
  uint iternum;
  int nel;
  long index;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  RealScalar RVar17;
  ReturnType dVal;
  double dVar18;
  RealScalar RVar19;
  RealScalar RVar20;
  undefined1 auVar21 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar22 [64];
  double dVar23;
  int nx;
  double local_1c8;
  undefined8 uStack_1c0;
  double beta;
  double alpha;
  ChVectorDynamic<> mz;
  ChVectorDynamic<> mx;
  undefined1 local_188 [16];
  ChVectorDynamic<> mp;
  ChVectorDynamic<> mZMr;
  ChVectorDynamic<> mZp;
  ChVectorDynamic<> mDi;
  ChVectorDynamic<> mr;
  ChVectorDynamic<> md;
  ChVectorDynamic<> mtmp;
  ChVectorDynamic<> mZMr_old;
  ChVectorDynamic<> mMZp;
  ChVectorDynamic<> mz_old;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_a0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_70;
  undefined1 extraout_var [56];
  
  (this->super_ChIterativeSolverVI).m_iterations = 0;
  iVar10 = (*sysd->_vptr_ChSystemDescriptor[7])(sysd);
  iVar11 = (*sysd->_vptr_ChSystemDescriptor[8])(sysd);
  iVar11 = iVar11 + iVar10;
  nx = iVar11;
  if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
    pCVar12 = GetLog();
    pCVar13 = ChStreamOutAscii::operator<<
                        (&pCVar12->super_ChStreamOutAscii,
                         "\n-----Projected MINRES -supporting stiffness-, n.vars nx=");
    pCVar13 = ChStreamOutAscii::operator<<(pCVar13,iVar11);
    pCVar13 = ChStreamOutAscii::operator<<(pCVar13,"  max.iters=");
    pCVar13 = ChStreamOutAscii::operator<<
                        (pCVar13,(this->super_ChIterativeSolverVI).super_ChIterativeSolver.
                                 m_max_iterations);
    ChStreamOutAscii::operator<<(pCVar13,"\n");
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&mx,&nx);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&md,&nx);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&mp,&nx);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&mr,&nx);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&mz,&nx);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&mz_old,&nx);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&mZp,&nx);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&mMZp,&nx);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&mZMr,&nx);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&mZMr_old,&nx);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&mtmp,&nx);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&mDi,&nx);
  (*sysd->_vptr_ChSystemDescriptor[0xf])(sysd,&mDi);
  for (index = 0;
      index < mDi.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      index = index + 1) {
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&mDi,index);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = *pSVar14;
    auVar15._8_8_ = 0x7fffffffffffffff;
    auVar15._0_8_ = 0x7fffffffffffffff;
    auVar15 = vandpd_avx512vl(auVar16,auVar15);
    if (auVar15._0_8_ <= 1e-09) {
      pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&mDi,index)
      ;
      *pSVar14 = 1.0;
    }
    else {
      pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&mDi,index)
      ;
      local_1c8 = *pSVar14;
      pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&mDi,index)
      ;
      *pSVar14 = 1.0 / local_1c8;
    }
  }
  if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_warm_start == false) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mx);
  }
  else {
    (*sysd->_vptr_ChSystemDescriptor[0x14])(sysd,&mx,1);
  }
  (*sysd->_vptr_ChSystemDescriptor[0xe])(sysd,&md);
  local_1c8 = (this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_tolerance;
  dVar23 = this->rel_tolerance;
  RVar17 = Eigen::internal::lpNorm_selector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::run
                     ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&md);
  local_188._8_8_ = local_188._0_8_;
  local_188._0_8_ = RVar17;
  (*sysd->_vptr_ChSystemDescriptor[0x19])(sysd,&mx);
  (*sysd->_vptr_ChSystemDescriptor[0x17])(sysd,&mr,&mx);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&local_70,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&md,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mr);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&mr,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&local_70);
  if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_use_precond == true) {
    alpha = (double)&mDi;
    local_a0._0_8_ = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mr;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,-1,1,0,-1,1>>>::operator*
              ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_70,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>> *)&local_a0,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)&alpha);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>const,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>const>>
              (&mp,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)&local_70);
  }
  else {
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>(&mp,&mr);
  }
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>(&mz,&mp);
  (*sysd->_vptr_ChSystemDescriptor[0x17])(sysd,&mZMr,&mz);
  (*sysd->_vptr_ChSystemDescriptor[0x17])(sysd,&mZp,&mp);
  iternum = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_1c8;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = RVar17 * dVar23;
  auVar15 = vmaxsd_avx(auVar21,auVar2);
  do {
    if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations <= (int)iternum)
    {
LAB_00d14db6:
      (*sysd->_vptr_ChSystemDescriptor[0x15])(sysd,&mx);
      if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
        pCVar12 = GetLog();
        pCVar13 = ChStreamOutAscii::operator<<(&pCVar12->super_ChStreamOutAscii,"residual: ");
        RVar19 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                           ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mr);
        pCVar13 = ChStreamOutAscii::operator<<(pCVar13,RVar19);
        ChStreamOutAscii::operator<<(pCVar13," ---\n");
      }
      local_1c8 = this->r_proj_resid;
      Eigen::internal::handmade_aligned_free
                (mDi.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                );
      Eigen::internal::handmade_aligned_free
                (mtmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data);
      Eigen::internal::handmade_aligned_free
                (mZMr_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data);
      Eigen::internal::handmade_aligned_free
                (mZMr.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data);
      Eigen::internal::handmade_aligned_free
                (mMZp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data);
      Eigen::internal::handmade_aligned_free
                (mZp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                );
      Eigen::internal::handmade_aligned_free
                (mz_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data);
      Eigen::internal::handmade_aligned_free
                (mz.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
      Eigen::internal::handmade_aligned_free
                (mr.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
      Eigen::internal::handmade_aligned_free
                (mp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
      Eigen::internal::handmade_aligned_free
                (md.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
      Eigen::internal::handmade_aligned_free
                (mx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
      return local_1c8;
    }
    if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_use_precond == true) {
      local_a0._0_8_ = &mZp;
      alpha = (double)&mDi;
      Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,-1,1,0,-1,1>>>::operator*
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_70,
                 (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>> *)&local_a0,
                 (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)&alpha)
      ;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>const,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>const>>
                (&mMZp,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)&local_70);
    }
    else {
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (&mMZp,&mZp);
    }
    local_1c8 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
                dot<Eigen::Matrix<double,_1,1,0,_1,1>>
                          ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&mz,
                           (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mZMr);
    uStack_1c0 = extraout_XMM0_Qb;
    dVal = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
           dot<Eigen::Matrix<double,_1,1,0,_1,1>>
                     ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&mMZp,
                      (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mZp);
    auVar7._8_8_ = extraout_XMM0_Qb_00;
    auVar7._0_8_ = dVal;
    auVar3._8_8_ = 0x7fffffffffffffff;
    auVar3._0_8_ = 0x7fffffffffffffff;
    auVar16 = vandpd_avx512vl(auVar7,auVar3);
    if (1e-29 <= auVar16._0_8_) {
      local_188._0_8_ = dVal;
    }
    else {
      local_188._0_8_ = 0x39e95a5efea6b347;
      if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
        pCVar12 = GetLog();
        pCVar13 = ChStreamOutAscii::operator<<
                            (&pCVar12->super_ChStreamOutAscii,
                             "Rayleigh alpha denominator breakdown: ");
        pCVar13 = ChStreamOutAscii::operator<<(pCVar13,local_1c8);
        pCVar13 = ChStreamOutAscii::operator<<(pCVar13," / ");
        pCVar13 = ChStreamOutAscii::operator<<(pCVar13,dVal);
        pCVar13 = ChStreamOutAscii::operator<<(pCVar13,"=");
        pCVar13 = ChStreamOutAscii::operator<<(pCVar13,local_1c8 / dVal);
        pCVar13 = ChStreamOutAscii::operator<<(pCVar13,"  iter=");
        pCVar13 = ChStreamOutAscii::operator<<(pCVar13,iternum);
        ChStreamOutAscii::operator<<(pCVar13,"\n");
        local_188._0_8_ = 0x39e95a5efea6b347;
      }
    }
    auVar5._8_8_ = uStack_1c0;
    auVar5._0_8_ = local_1c8;
    auVar4._8_8_ = 0x7fffffffffffffff;
    auVar4._0_8_ = 0x7fffffffffffffff;
    auVar16 = vandpd_avx512vl(auVar5,auVar4);
    dVar23 = (double)local_188._0_8_;
    dVar18 = local_1c8;
    if (auVar16._0_8_ < 1e-29) {
      dVar23 = 1.0;
      dVar18 = 1.0;
      if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
        pCVar12 = GetLog();
        pCVar13 = ChStreamOutAscii::operator<<
                            (&pCVar12->super_ChStreamOutAscii,"Rayleigh alpha numerator breakdown: "
                            );
        pCVar13 = ChStreamOutAscii::operator<<(pCVar13,local_1c8);
        pCVar13 = ChStreamOutAscii::operator<<(pCVar13," / ");
        pCVar13 = ChStreamOutAscii::operator<<(pCVar13,(double)local_188._0_8_);
        pCVar13 = ChStreamOutAscii::operator<<(pCVar13,"=");
        pCVar13 = ChStreamOutAscii::operator<<(pCVar13,local_1c8 / (double)local_188._0_8_);
        pCVar13 = ChStreamOutAscii::operator<<(pCVar13,"  iter=");
        pCVar13 = ChStreamOutAscii::operator<<(pCVar13,iternum);
        ChStreamOutAscii::operator<<(pCVar13,"\n");
        dVar23 = 1.0;
        dVar18 = 1.0;
      }
    }
    alpha = dVar18 / dVar23;
    if ((alpha < 0.0) &&
       ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true)) {
      pCVar12 = GetLog();
      pCVar13 = ChStreamOutAscii::operator<<
                          (&pCVar12->super_ChStreamOutAscii,"Rayleigh alpha < 0: ");
      pCVar13 = ChStreamOutAscii::operator<<(pCVar13,alpha);
      pCVar13 = ChStreamOutAscii::operator<<(pCVar13,"    iter=");
      pCVar13 = ChStreamOutAscii::operator<<(pCVar13,iternum);
      ChStreamOutAscii::operator<<(pCVar13,"\n");
    }
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                      *)&local_70,&alpha,(StorageBaseType *)&mp);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&mtmp,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)&local_70);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&mx,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mtmp);
    RVar19 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                       ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mtmp);
    (*sysd->_vptr_ChSystemDescriptor[0x19])(sysd,&mx);
    (*sysd->_vptr_ChSystemDescriptor[0x17])
              (sysd,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mr,&mx);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
              ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)&local_70,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&md,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mr);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&mr,
               (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)&local_70);
    piVar1 = &(this->super_ChIterativeSolverVI).m_iterations;
    *piVar1 = *piVar1 + 1;
    RVar20 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                       ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mr);
    this->r_proj_resid = RVar20;
    if (RVar20 < auVar15._0_8_) {
      if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
        pCVar12 = GetLog();
        pCVar13 = ChStreamOutAscii::operator<<
                            (&pCVar12->super_ChStreamOutAscii,"P(r)-converged! iter=");
        pCVar13 = ChStreamOutAscii::operator<<(pCVar13,iternum);
        pCVar13 = ChStreamOutAscii::operator<<(pCVar13," |P(r)|=");
        pCVar13 = ChStreamOutAscii::operator<<(pCVar13,this->r_proj_resid);
        ChStreamOutAscii::operator<<(pCVar13,"\n");
      }
      goto LAB_00d14db6;
    }
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (&mz_old,&mz);
    if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_use_precond == true) {
      beta = (double)&mDi;
      local_a0._0_8_ = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mr;
      Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,-1,1,0,-1,1>>>::operator*
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_70,
                 (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>> *)&local_a0,
                 (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)&beta);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>const,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>const>>
                (&mz,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)&local_70);
    }
    else {
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (&mz,(Matrix<double,__1,_1,_0,__1,_1> *)&mr);
    }
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (&mZMr_old,&mZMr);
    (*sysd->_vptr_ChSystemDescriptor[0x17])(sysd,&mZMr,&mz);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
              ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)&local_70,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&mZMr,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mZMr_old);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&mtmp,
               (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)&local_70);
    local_1c8 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
                dot<Eigen::Matrix<double,_1,1,0,_1,1>>
                          ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&mz,
                           (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mtmp);
    uStack_1c0 = extraout_XMM0_Qb_01;
    auVar22._0_8_ =
         Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
         dot<Eigen::Matrix<double,_1,1,0,_1,1>>
                   ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&mz_old,
                    (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mZMr_old);
    auVar22._8_56_ = extraout_var;
    auVar6._8_8_ = uStack_1c0;
    auVar6._0_8_ = local_1c8;
    beta = local_1c8 / auVar22._0_8_;
    auVar8._8_8_ = 0x7fffffffffffffff;
    auVar8._0_8_ = 0x7fffffffffffffff;
    auVar16 = vandpd_avx(auVar6,auVar8);
    if ((auVar16._0_8_ < 1e-29) ||
       (auVar9._8_8_ = 0x7fffffffffffffff, auVar9._0_8_ = 0x7fffffffffffffff,
       auVar16 = vandpd_avx(auVar22._0_16_,auVar9), auVar16._0_8_ < 1e-29)) {
      if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
        pCVar12 = GetLog();
        pCVar13 = ChStreamOutAscii::operator<<
                            (&pCVar12->super_ChStreamOutAscii,"Ribiere quotient beta restart: ");
        pCVar13 = ChStreamOutAscii::operator<<(pCVar13,local_1c8);
        pCVar13 = ChStreamOutAscii::operator<<(pCVar13," / ");
        pCVar13 = ChStreamOutAscii::operator<<(pCVar13,auVar22._0_8_);
        pCVar13 = ChStreamOutAscii::operator<<(pCVar13,"  iter=");
        pCVar13 = ChStreamOutAscii::operator<<(pCVar13,iternum);
        ChStreamOutAscii::operator<<(pCVar13,"\n");
      }
      beta = 0.0;
      local_188 = auVar22._0_16_;
    }
    Eigen::operator*(&local_a0,&beta,(StorageBaseType *)&mp);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              (&local_70,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&mz,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_a0);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
              (&mp,&local_70);
    Eigen::operator*(&local_a0,&beta,(StorageBaseType *)&mZp);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              (&local_70,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&mZMr,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_a0);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
              (&mZp,&local_70);
    if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
      ChIterativeSolverVI::AtIterationEnd
                (&this->super_ChIterativeSolverVI,this->r_proj_resid,RVar19,iternum);
    }
    iternum = iternum + 1;
  } while( true );
}

Assistant:

double ChSolverPMINRES::Solve_SupportingStiffness(ChSystemDescriptor& sysd) {
    m_iterations = 0;

    // Allocate auxiliary vectors;

    int nv = sysd.CountActiveVariables();
    int nc = sysd.CountActiveConstraints();
    int nx = nv + nc;  // total scalar unknowns, in x vector for full KKT system Z*x-d=0

    if (verbose)
        GetLog() << "\n-----Projected MINRES -supporting stiffness-, n.vars nx=" << nx
                 << "  max.iters=" << m_max_iterations << "\n";

    ChVectorDynamic<> mx(nx);
    ChVectorDynamic<> md(nx);
    ChVectorDynamic<> mp(nx);
    ChVectorDynamic<> mr(nx);
    ChVectorDynamic<> mz(nx);
    ChVectorDynamic<> mz_old(nx);
    ChVectorDynamic<> mZp(nx);
    ChVectorDynamic<> mMZp(nx);
    ChVectorDynamic<> mZMr(nx);
    ChVectorDynamic<> mZMr_old(nx);
    ChVectorDynamic<> mtmp(nx);
    ChVectorDynamic<> mDi(nx);

    //
    // --- Compute a diagonal (scaling) preconditioner for the KKT system:
    //

    // Initialize the mDi vector with the diagonal of the Z matrix
    sysd.BuildDiagonalVector(mDi);

    // Pre-invert the values, to avoid wasting time with divisions in the following.
    // From now, mDi contains the inverse of the diagonal of Z.
    // Note, for constraints, the diagonal is 0, so set inverse of D as 1 assuming
    // a constraint preconditioning and assuming the dot product of jacobians is already about 1.
    for (int nel = 0; nel < mDi.size(); nel++) {
        if (fabs(mDi(nel)) > 1e-9)
            mDi(nel) = 1.0 / mDi(nel);
        else
            mDi(nel) = 1.0;
    }

    //
    // --- Vector initialization and book-keeping
    //

    // Initialize the x vector of unknowns x ={q; -l} (if warm starting needed, initialize
    // x with current values of q and l in variables and constraints)
    if (m_warm_start)
        sysd.FromUnknownsToVector(mx);
    else
        mx.setZero();

    // Initialize the d vector filling it with {f, -b}
    sysd.BuildDiVector(md);

    //
    // --- THE P-MINRES ALGORITHM
    //

    double rel_tol = this->rel_tolerance;
    double abs_tol = m_tolerance;
    double rel_tol_d = md.lpNorm<Eigen::Infinity>() * rel_tol;

    // Initial projection of mx   ***TO DO***?
    sysd.UnknownsProject(mx);

    // r = d - Z*x;
    sysd.SystemProduct(mr, mx);  // r = Z*x
    mr = md - mr;                 // r =-Z*x+d

    if (m_use_precond)
        mp = mr.array() * mDi.array();
    else
        mp = mr;

    // z = Mi * r;
    mz = mp;

    // ZMr = Z*M*r = Z*z
    sysd.SystemProduct(mZMr, mz);  // ZMr = Z*z

    // Zp = Z*p
    sysd.SystemProduct(mZp, mp);  // Zp = Z*p

    //
    // THE LOOP
    //

    for (int iter = 0; iter < m_max_iterations; iter++) {
        // MZp = Mi*Zp; % = Mi*Z*p                  %% -- Precond
        if (m_use_precond)
            mMZp = mZp.array() * mDi.array();
        else
            mMZp = mZp;

        // alpha = (z'*(ZMr))/((MZp)'*(Zp));
        double zZMr = mz.dot(mZMr);    // zZMr = z'* ZMr
        double MZpZp = mMZp.dot(mZp);  // MZpZp = ((MZp)'*(Zp))

        // Robustness improver: case of division by zero
        if (fabs(MZpZp) < 10e-30) {
            if (verbose)
                GetLog() << "Rayleigh alpha denominator breakdown: " << zZMr << " / " << MZpZp << "=" << (zZMr / MZpZp)
                         << "  iter=" << iter << "\n";
            MZpZp = 10e-30;
        }

        // Robustness improver: case when r is orthogonal to Z*r (e.g. at first iteration, if f=0, x=0, with
        // constraints)
        if (fabs(zZMr) < 10e-30) {
            if (verbose)
                GetLog() << "Rayleigh alpha numerator breakdown: " << zZMr << " / " << MZpZp << "=" << (zZMr / MZpZp)
                         << "  iter=" << iter << "\n";
            zZMr = 1;
            MZpZp = 1;
        }

        double alpha = zZMr / MZpZp;  // 3)  alpha = (z'*(ZMr))/((MZp)'*(Zp));

        if (alpha < 0)
            if (verbose)
                GetLog() << "Rayleigh alpha < 0: " << alpha << "    iter=" << iter << "\n";

        // x = x + alpha * p;
        mtmp = alpha * mp;
        mx += mtmp;

        double maxdeltaunknowns = mtmp.norm();  //***better infinity norm for speed reasons?

        // x = Proj(x)
        sysd.UnknownsProject(mx);  // x = P(x)

        // r = d - Z*x;
        sysd.SystemProduct(mr, mx);  // r = Z*x
        mr = md - mr;                 // r =-Z*x+d

        m_iterations++;

        // Terminate iteration when the projected r is small, if (norm(r,2) <= max(rel_tol_d,abs_tol))
        r_proj_resid = mr.norm();
        if (r_proj_resid < ChMax(rel_tol_d, abs_tol)) {
            if (verbose)
                GetLog() << "P(r)-converged! iter=" << iter << " |P(r)|=" << r_proj_resid << "\n";
            break;
        }

        // z_old = z;
        mz_old = mz;

        // z = Mi*r;                                 %% -- Precond
        if (m_use_precond)
            mz = mr.array() * mDi.array();
        else
            mz = mr;

        // ZMr_old = ZMr;
        mZMr_old = mZMr;

        // ZMr = Z*z;
        sysd.SystemProduct(mZMr, mz);  // ZMr = Z*z

        // Ribiere quotient (for flexible preconditioning)
        //    beta = z'*(ZMr-ZMr_old)/(z_old'*(ZMr_old));
        mtmp = mZMr - mZMr_old;
        double numerator = mz.dot(mtmp);
        double denominator = mz_old.dot(mZMr_old);
        // Rayleigh quotient (original Minres)
        /// double numerator   = mr.MatrDot(mz,mZMr);			// 1)  r'* Z *r
        /// double denominator = mr.MatrDot(mz_old,mZMr_old);	// 2)  r_old'* Z *r_old
        double beta = numerator / denominator;

        // Robustness improver: restart if beta=0 or too large
        if (fabs(denominator) < 10e-30 || fabs(numerator) < 10e-30) {
            if (verbose)
                GetLog() << "Ribiere quotient beta restart: " << numerator << " / " << denominator << "  iter=" << iter
                         << "\n";
            beta = 0;
        }

        // p = z + beta * p;
        mp = mz + beta * mp;

        // Zp = ZMr + beta*Zp;   // Optimization!! avoid matr x vect!!! (if no 'p' projection has been done)
        mZp = mZMr + beta * mZp;

        // ---------------------------------------------
        // METRICS - convergence, plots, etc

        // For recording into correction/residuals/violation history, if debugging
        if (this->record_violation_history)
            AtIterationEnd(r_proj_resid, maxdeltaunknowns, iter);
    }

    // After having solved for unknowns x={q;-l}, now copy those values from x vector to
    // the q values in ChVariable items and to l values in ChConstraint items
    sysd.FromVectorToUnknowns(mx);

    if (verbose)
        GetLog() << "residual: " << mr.norm() << " ---\n";

    return r_proj_resid;
}